

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ldc2_w(ExecutionEngine *this)

{
  CONSTANT_Long_info CVar1;
  Value operand;
  Value operand_00;
  Value operand_01;
  int iVar2;
  uint uVar3;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar4;
  cp_info **ppcVar5;
  ostream *poVar6;
  __type_conflict _Var7;
  ulong local_f0;
  undefined4 local_c8;
  Value padding_1;
  double doubleNumber;
  int64_t m;
  int32_t e;
  int32_t s;
  int64_t longNumber_1;
  u4 lowBytes_1;
  u4 highBytes_1;
  undefined4 local_80;
  Value padding;
  int64_t longNumber;
  u4 lowBytes;
  u4 highBytes;
  Value value;
  cp_info entry;
  cp_info *classFile;
  u2 index;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar4 = Frame::getCode(this_01,this_01->pc);
  classFile._6_2_ = CONCAT11(puVar4[1],puVar4[2]);
  ppcVar5 = Frame::getConstantPool(this_01);
  CVar1 = (*ppcVar5)[(int)(classFile._6_2_ - 1)].info.long_info;
  value.data.booleanValue = SUB81(*(undefined8 *)(*ppcVar5 + (int)(classFile._6_2_ - 1)),0);
  entry._0_4_ = CVar1.high_bytes;
  entry._4_4_ = CVar1.low_bytes;
  if (value.data.booleanValue == true) {
    value.type = entry._0_4_;
    value.printType = entry._4_4_;
    highBytes = 6;
    operand_01.type = 10;
    operand_01.printType = local_80;
    operand_01.data = (anon_union_8_10_52016fac_for_data)padding._0_8_;
    Frame::pushIntoOperandStack(this_01,operand_01);
  }
  else {
    if (value.data.booleanValue != true) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "ldc2_w tentando acessar um elemento da CP invalido: ");
      poVar6 = std::operator<<(poVar6,value.data.charValue);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    iVar2 = -1;
    if (-1 < (int)entry._0_4_) {
      iVar2 = 1;
    }
    uVar3 = (int)entry._0_4_ >> 0x14 & 0x7ff;
    if (uVar3 == 0) {
      local_f0 = (CONCAT44(entry._0_4_,entry._4_4_) & 0xfffffffffffff) << 1;
    }
    else {
      local_f0 = CONCAT44(entry._0_4_,entry._4_4_) & 0xfffffffffffff | 0x10000000000000;
    }
    _Var7 = std::pow<int,int>(2,uVar3 - 0x433);
    value._0_8_ = (double)(long)((long)iVar2 * local_f0) * _Var7;
    highBytes = 7;
    operand_00.type = 10;
    operand_00.printType = local_c8;
    operand_00.data = (anon_union_8_10_52016fac_for_data)padding_1._0_8_;
    Frame::pushIntoOperandStack(this_01,operand_00);
  }
  operand.type = highBytes;
  operand.printType = lowBytes;
  operand.data = (anon_union_8_10_52016fac_for_data)value._0_8_;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 3;
  return;
}

Assistant:

void ExecutionEngine::i_ldc2_w() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    u2 index = (byte1 << 8) | byte2;
    
    cp_info *classFile = *(topFrame->getConstantPool());
    cp_info entry = classFile[index-1];
    
    Value value;
    
    if (entry.tag == CONSTANT_Long) {
        u4 highBytes = entry.info.long_info.high_bytes;
        u4 lowBytes = entry.info.long_info.low_bytes;
        
        int64_t longNumber = ((int64_t) highBytes << 32) + lowBytes;
        value.type = ValueType::LONG;
        value.data.longValue = longNumber;
        
        Value padding;
        padding.type = ValueType::PADDING;
        
        topFrame->pushIntoOperandStack(padding);
    } else if (entry.tag == CONSTANT_Double) {
        u4 highBytes = entry.info.double_info.high_bytes;
        u4 lowBytes = entry.info.double_info.low_bytes;
        
        int64_t longNumber = ((int64_t) highBytes << 32) + lowBytes;
        
        int32_t s = ((longNumber >> 63) == 0) ? 1 : -1;
        int32_t e = (int32_t)((longNumber >> 52) & 0x7ffL);
        int64_t m = (e == 0) ? (longNumber & 0xfffffffffffffL) << 1 : (longNumber & 0xfffffffffffffL) | 0x10000000000000L;
        
        double doubleNumber = s*m*pow(2, e-1075);
        value.type = ValueType::DOUBLE;
        value.data.doubleValue = doubleNumber;
        
        Value padding;
        padding.type = ValueType::PADDING;
        
        topFrame->pushIntoOperandStack(padding);
    } else {
        cerr << "ldc2_w tentando acessar um elemento da CP invalido: " << entry.tag << endl;
        exit(1);
    }
    
    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 3;
}